

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.cc
# Opt level: O1

ostream * operator<<(ostream *os,JournalOperation *opj)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  long *plVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Operation: ",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(opj->name)._M_dataplus._M_p,(opj->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," applied on ",0xc);
  __s = ctime(&opj->timestamp);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"Tool: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(opj->tool)._M_dataplus._M_p,(opj->tool)._M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Details: ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(opj->detail)._M_dataplus._M_p,(opj->detail)._M_string_length);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const JournalOperation &opj) {
    os << "Operation: " << opj.name << " applied on " << ctime(&opj.timestamp);
    os << "Tool: " << opj.tool << std::endl;
    os << "Details: " << opj.detail << std::endl << std::endl;
    return os;
}